

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O2

PDFImageXObject * __thiscall TIFFImageHandler::WriteUntiledImageXObject(TIFFImageHandler *this)

{
  IDocumentContextExtender *pIVar1;
  int iVar2;
  EStatusCode EVar3;
  ObjectIDType inImageObjectID;
  DictionaryContext *inImageContext;
  Trace *this_00;
  PDFStream *inImageStream;
  PDFImageXObject *this_01;
  char *inFormat;
  
  inImageObjectID = ObjectsContext::StartNewIndirectObject(this->mObjectsContext);
  if (inImageObjectID == 0) {
    this_00 = Trace::DefaultTrace();
    inFormat = 
    "TIFFImageHandler::WriteUntiledImageXObject, unexpected failure. unable to create image xobject"
    ;
LAB_001b5892:
    this_01 = (PDFImageXObject *)0x0;
    Trace::TraceToLog(this_00,inFormat);
  }
  else {
    inImageContext = ObjectsContext::StartDictionary(this->mObjectsContext);
    WriteCommonImageDictionaryProperties(this,inImageContext);
    DictionaryContext::WriteKey(inImageContext,&scWidth_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(inImageContext,(ulong)this->mT2p->tiff_width);
    DictionaryContext::WriteKey(inImageContext,&scHeight_abi_cxx11_);
    DictionaryContext::WriteIntegerValue(inImageContext,(ulong)this->mT2p->tiff_length);
    WriteImageXObjectFilter(this,inImageContext,0);
    pIVar1 = this->mExtender;
    if (pIVar1 != (IDocumentContextExtender *)0x0) {
      iVar2 = (*pIVar1->_vptr_IDocumentContextExtender[7])
                        (pIVar1,inImageObjectID,inImageContext,this->mObjectsContext,
                         this->mContainerDocumentContext,this);
      if (iVar2 != 0) {
        this_00 = Trace::DefaultTrace();
        inFormat = 
        "TIFFImageHandler::WriteTileImageXObject, unexpected failure. extender declared failure when writing image xobject."
        ;
        goto LAB_001b5892;
      }
    }
    inImageStream = ObjectsContext::StartUnfilteredPDFStream(this->mObjectsContext,inImageContext);
    CalculateTiffSizeNoTiles(this);
    EVar3 = WriteImageData(this,inImageStream);
    if (EVar3 == eSuccess) {
      EVar3 = ObjectsContext::EndPDFStream(this->mObjectsContext,inImageStream);
      if (EVar3 != eSuccess) goto LAB_001b5874;
      this_01 = (PDFImageXObject *)operator_new(0x20);
      PDFImageXObject::PDFImageXObject(this_01,inImageObjectID);
      AddImagesProcsets(this,this_01);
    }
    else {
LAB_001b5874:
      this_01 = (PDFImageXObject *)0x0;
    }
    if (inImageStream != (PDFStream *)0x0) {
      PDFStream::~PDFStream(inImageStream);
      goto LAB_001b58a2;
    }
  }
  inImageStream = (PDFStream *)0x0;
LAB_001b58a2:
  operator_delete(inImageStream,0xf0);
  return this_01;
}

Assistant:

PDFImageXObject* TIFFImageHandler::WriteUntiledImageXObject()
{
	PDFImageXObject* imageXObject = NULL;
	PDFStream* imageStream = NULL;

	do
	{
		ObjectIDType imageXObjectID = mObjectsContext->StartNewIndirectObject();
		if(imageXObjectID == 0)
		{
			TRACE_LOG("TIFFImageHandler::WriteUntiledImageXObject, unexpected failure. unable to create image xobject");
			break;
		}		
		DictionaryContext* imageContext = mObjectsContext->StartDictionary();
	
		WriteCommonImageDictionaryProperties(imageContext);

		// width
		imageContext->WriteKey(scWidth);
		imageContext->WriteIntegerValue(mT2p->tiff_width);

		// height
		imageContext->WriteKey(scHeight);
		imageContext->WriteIntegerValue(mT2p->tiff_length);

		// filter
		WriteImageXObjectFilter(imageContext,0);


		if(mExtender)
		{
			if(mExtender->OnTIFFImageXObjectWrite(imageXObjectID,imageContext,mObjectsContext,mContainerDocumentContext,this) != PDFHummus::eSuccess)
			{
				TRACE_LOG("TIFFImageHandler::WriteTileImageXObject, unexpected failure. extender declared failure when writing image xobject.");
				break;
			}
		}	

		imageStream = mObjectsContext->StartUnfilteredPDFStream(imageContext);

		CalculateTiffSizeNoTiles();

		if(WriteImageData(imageStream) != PDFHummus::eSuccess)
			break;

		if(mObjectsContext->EndPDFStream(imageStream) != PDFHummus::eSuccess)
			break;

		// Creating Image XObject procset value is dummy, because resources  on the 
		// container will be set externally.
		imageXObject = new PDFImageXObject(imageXObjectID);
		AddImagesProcsets(imageXObject);
	} while(false);


	delete imageStream;
	return imageXObject;
	
}